

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O0

void __thiscall
ncnn::Crop::resolve_crop_roi
          (Crop *this,Mat *bottom_blob,int *_woffset,int *_hoffset,int *_doffset,int *_coffset,
          int *_outw,int *_outh,int *_outd,int *_outc)

{
  int iVar1;
  int *piVar2;
  int *in_RCX;
  int *in_RDX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  int *in_R9;
  bool bVar3;
  int *in_stack_00000008;
  int *in_stack_00000010;
  int *in_stack_00000018;
  int *in_stack_00000020;
  int end;
  int start;
  int axis_1;
  int i_1;
  int axis;
  int i;
  int num_axis;
  int _axes [4];
  int *axes_ptr;
  int *ends_ptr;
  int *starts_ptr;
  bool numpy_style_slice;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  int local_160;
  int local_15c;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  bool local_102;
  byte local_101;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8 [4];
  long local_98;
  long local_90;
  long local_88;
  byte local_7d;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int *local_68;
  int *local_60;
  int *local_58;
  int *local_50;
  long *local_38;
  long *local_30;
  long *local_28;
  long *local_20;
  long *local_18;
  long *local_10;
  long *local_8;
  
  local_6c = *(int *)(in_RSI + 0x2c);
  local_70 = *(int *)(in_RSI + 0x30);
  local_74 = *(int *)(in_RSI + 0x34);
  local_78 = *(int *)(in_RSI + 0x38);
  local_ac = *(int *)(in_RSI + 0x28);
  local_7c = local_ac;
  local_30 = (long *)(in_RDI + 0x100);
  bVar3 = true;
  if (*local_30 != 0) {
    local_10 = local_30;
    bVar3 = *(long *)(in_RDI + 0x140) * (long)*(int *)(in_RDI + 0x138) == 0;
  }
  local_101 = 0;
  if (!bVar3) {
    local_38 = (long *)(in_RDI + 0x148);
    local_102 = true;
    if (*local_38 != 0) {
      local_8 = local_38;
      local_102 = *(long *)(in_RDI + 0x188) * (long)*(int *)(in_RDI + 0x180) == 0;
    }
    local_101 = local_102 ^ 0xff;
  }
  local_7d = local_101 & 1;
  if ((local_101 & 1) == 0) {
    *in_RDX = *(int *)(in_RDI + 0xd0);
    *in_RCX = *(int *)(in_RDI + 0xd4);
    *in_R8 = *(int *)(in_RDI + 0xd8);
    *in_R9 = *(int *)(in_RDI + 0xdc);
    *in_stack_00000008 = local_6c;
    *in_stack_00000010 = local_70;
    *in_stack_00000018 = local_74;
    *in_stack_00000020 = local_78;
    if ((local_ac == 1) &&
       (*in_stack_00000008 = (local_6c - *(int *)(in_RDI + 0xd0)) - *(int *)(in_RDI + 0xf0),
       *(int *)(in_RDI + 0xe0) != -0xe9)) {
      piVar2 = std::min<int>((int *)(in_RDI + 0xe0),in_stack_00000008);
      *in_stack_00000008 = *piVar2;
    }
    if (local_7c == 2) {
      *in_stack_00000008 = (local_6c - *(int *)(in_RDI + 0xd0)) - *(int *)(in_RDI + 0xf0);
      if (*(int *)(in_RDI + 0xe0) != -0xe9) {
        piVar2 = std::min<int>((int *)(in_RDI + 0xe0),in_stack_00000008);
        *in_stack_00000008 = *piVar2;
      }
      *in_stack_00000010 = (local_70 - *(int *)(in_RDI + 0xd4)) - *(int *)(in_RDI + 0xf4);
      if (*(int *)(in_RDI + 0xe4) != -0xe9) {
        piVar2 = std::min<int>((int *)(in_RDI + 0xe4),in_stack_00000010);
        *in_stack_00000010 = *piVar2;
      }
    }
    if (local_7c == 3) {
      *in_stack_00000008 = (local_6c - *(int *)(in_RDI + 0xd0)) - *(int *)(in_RDI + 0xf0);
      if (*(int *)(in_RDI + 0xe0) != -0xe9) {
        piVar2 = std::min<int>((int *)(in_RDI + 0xe0),in_stack_00000008);
        *in_stack_00000008 = *piVar2;
      }
      *in_stack_00000010 = (local_70 - *(int *)(in_RDI + 0xd4)) - *(int *)(in_RDI + 0xf4);
      if (*(int *)(in_RDI + 0xe4) != -0xe9) {
        piVar2 = std::min<int>((int *)(in_RDI + 0xe4),in_stack_00000010);
        *in_stack_00000010 = *piVar2;
      }
      *in_stack_00000020 = (local_78 - *(int *)(in_RDI + 0xdc)) - *(int *)(in_RDI + 0xfc);
      if (*(int *)(in_RDI + 0xec) != -0xe9) {
        piVar2 = std::min<int>((int *)(in_RDI + 0xec),in_stack_00000020);
        *in_stack_00000020 = *piVar2;
      }
    }
    if (local_7c == 4) {
      *in_stack_00000008 = (local_6c - *(int *)(in_RDI + 0xd0)) - *(int *)(in_RDI + 0xf0);
      if (*(int *)(in_RDI + 0xe0) != -0xe9) {
        piVar2 = std::min<int>((int *)(in_RDI + 0xe0),in_stack_00000008);
        *in_stack_00000008 = *piVar2;
      }
      *in_stack_00000010 = (local_70 - *(int *)(in_RDI + 0xd4)) - *(int *)(in_RDI + 0xf4);
      if (*(int *)(in_RDI + 0xe4) != -0xe9) {
        piVar2 = std::min<int>((int *)(in_RDI + 0xe4),in_stack_00000010);
        *in_stack_00000010 = *piVar2;
      }
      *in_stack_00000018 = (local_74 - *(int *)(in_RDI + 0xd8)) - *(int *)(in_RDI + 0xf8);
      if (*(int *)(in_RDI + 0xe8) != -0xe9) {
        piVar2 = std::min<int>((int *)(in_RDI + 0xe8),in_stack_00000018);
        *in_stack_00000018 = *piVar2;
      }
      *in_stack_00000020 = (local_78 - *(int *)(in_RDI + 0xdc)) - *(int *)(in_RDI + 0xfc);
      if (*(int *)(in_RDI + 0xec) != -0xe9) {
        piVar2 = std::min<int>((int *)(in_RDI + 0xec),in_stack_00000020);
        *in_stack_00000020 = *piVar2;
      }
    }
  }
  else {
    *in_RDX = 0;
    *in_RCX = 0;
    *in_R8 = 0;
    *in_R9 = 0;
    *in_stack_00000008 = local_6c;
    *in_stack_00000010 = local_70;
    *in_stack_00000018 = local_74;
    *in_stack_00000020 = local_78;
    local_18 = (long *)(in_RDI + 0x100);
    local_88 = *(long *)(in_RDI + 0x100);
    local_20 = (long *)(in_RDI + 0x148);
    local_90 = *(long *)(in_RDI + 0x148);
    local_28 = (long *)(in_RDI + 400);
    local_98 = *(long *)(in_RDI + 400);
    local_a8[0] = 0;
    local_a8[1] = 1;
    local_a8[2] = 2;
    local_a8[3] = 3;
    iVar1 = *(int *)(in_RDI + 0x1bc);
    local_68 = in_R9;
    local_60 = in_R8;
    local_58 = in_RCX;
    local_50 = in_RDX;
    if (iVar1 != 0) {
      for (local_b0 = 0; local_ac = iVar1, local_b0 < iVar1; local_b0 = local_b0 + 1) {
        local_b4 = *(int *)(local_98 + (long)local_b0 * 4);
        if (local_b4 < 0) {
          local_b4 = local_7c + local_b4;
        }
        local_a8[local_b0] = local_b4;
      }
    }
    for (local_b8 = 0; local_b8 < local_ac; local_b8 = local_b8 + 1) {
      local_bc = local_a8[local_b8];
      local_c0 = *(int *)(local_88 + (long)local_b8 * 4);
      local_c4 = *(int *)(local_90 + (long)local_b8 * 4);
      if (local_7c == 1) {
        if (local_c0 == -0xe9) {
          local_c0 = 0;
        }
        if (local_c4 == -0xe9) {
          local_c4 = local_6c;
        }
        if (local_c0 < 0) {
          local_114 = local_6c + local_c0;
        }
        else {
          local_114 = local_c0;
        }
        *local_50 = local_114;
        if (local_c4 < 1) {
          local_118 = local_6c + local_c4;
        }
        else {
          local_118 = local_c4;
        }
        local_c8 = local_118;
        piVar2 = std::min<int>(&local_6c,&local_c8);
        *in_stack_00000008 = *piVar2 - *local_50;
      }
      if (local_7c == 2) {
        if (local_bc == 0) {
          if (local_c0 == -0xe9) {
            local_c0 = 0;
          }
          if (local_c4 == -0xe9) {
            local_c4 = local_70;
          }
          if (local_c0 < 0) {
            local_11c = local_70 + local_c0;
          }
          else {
            local_11c = local_c0;
          }
          *local_58 = local_11c;
          if (local_c4 < 1) {
            local_120 = local_70 + local_c4;
          }
          else {
            local_120 = local_c4;
          }
          local_cc = local_120;
          piVar2 = std::min<int>(&local_70,&local_cc);
          *in_stack_00000010 = *piVar2 - *local_58;
        }
        if (local_bc == 1) {
          if (local_c0 == -0xe9) {
            local_c0 = 0;
          }
          if (local_c4 == -0xe9) {
            local_c4 = local_6c;
          }
          if (local_c0 < 0) {
            local_124 = local_6c + local_c0;
          }
          else {
            local_124 = local_c0;
          }
          *local_50 = local_124;
          if (local_c4 < 1) {
            local_128 = local_6c + local_c4;
          }
          else {
            local_128 = local_c4;
          }
          local_d0 = local_128;
          piVar2 = std::min<int>(&local_6c,&local_d0);
          *in_stack_00000008 = *piVar2 - *local_50;
        }
      }
      if (local_7c == 3) {
        if (local_bc == 0) {
          if (local_c0 == -0xe9) {
            local_c0 = 0;
          }
          if (local_c4 == -0xe9) {
            local_c4 = local_78;
          }
          if (local_c0 < 0) {
            local_12c = local_78 + local_c0;
          }
          else {
            local_12c = local_c0;
          }
          *local_68 = local_12c;
          if (local_c4 < 1) {
            local_130 = local_78 + local_c4;
          }
          else {
            local_130 = local_c4;
          }
          local_d4 = local_130;
          piVar2 = std::min<int>(&local_78,&local_d4);
          *in_stack_00000020 = *piVar2 - *local_68;
        }
        if (local_bc == 1) {
          if (local_c0 == -0xe9) {
            local_c0 = 0;
          }
          if (local_c4 == -0xe9) {
            local_c4 = local_70;
          }
          if (local_c0 < 0) {
            local_134 = local_70 + local_c0;
          }
          else {
            local_134 = local_c0;
          }
          *local_58 = local_134;
          if (local_c4 < 1) {
            local_138 = local_70 + local_c4;
          }
          else {
            local_138 = local_c4;
          }
          local_d8 = local_138;
          piVar2 = std::min<int>(&local_70,&local_d8);
          *in_stack_00000010 = *piVar2 - *local_58;
        }
        if (local_bc == 2) {
          if (local_c0 == -0xe9) {
            local_c0 = 0;
          }
          if (local_c4 == -0xe9) {
            local_c4 = local_6c;
          }
          if (local_c0 < 0) {
            local_13c = local_6c + local_c0;
          }
          else {
            local_13c = local_c0;
          }
          *local_50 = local_13c;
          if (local_c4 < 1) {
            local_140 = local_6c + local_c4;
          }
          else {
            local_140 = local_c4;
          }
          local_dc = local_140;
          piVar2 = std::min<int>(&local_6c,&local_dc);
          *in_stack_00000008 = *piVar2 - *local_50;
        }
      }
      if (local_7c == 4) {
        if (local_bc == 0) {
          if (local_c0 == -0xe9) {
            local_c0 = 0;
          }
          if (local_c4 == -0xe9) {
            local_c4 = local_78;
          }
          if (local_c0 < 0) {
            local_144 = local_78 + local_c0;
          }
          else {
            local_144 = local_c0;
          }
          *local_68 = local_144;
          if (local_c4 < 1) {
            local_148 = local_78 + local_c4;
          }
          else {
            local_148 = local_c4;
          }
          local_e0 = local_148;
          piVar2 = std::min<int>(&local_78,&local_e0);
          *in_stack_00000020 = *piVar2 - *local_68;
        }
        if (local_bc == 1) {
          if (local_c0 == -0xe9) {
            local_c0 = 0;
          }
          if (local_c4 == -0xe9) {
            local_c4 = local_74;
          }
          if (local_c0 < 0) {
            local_14c = local_74 + local_c0;
          }
          else {
            local_14c = local_c0;
          }
          *local_60 = local_14c;
          if (local_c4 < 1) {
            local_150 = local_74 + local_c4;
          }
          else {
            local_150 = local_c4;
          }
          local_e4 = local_150;
          piVar2 = std::min<int>(&local_74,&local_e4);
          *in_stack_00000018 = *piVar2 - *local_60;
        }
        if (local_bc == 2) {
          if (local_c0 == -0xe9) {
            local_c0 = 0;
          }
          if (local_c4 == -0xe9) {
            local_c4 = local_70;
          }
          if (local_c0 < 0) {
            local_154 = local_70 + local_c0;
          }
          else {
            local_154 = local_c0;
          }
          *local_58 = local_154;
          if (local_c4 < 1) {
            local_158 = local_70 + local_c4;
          }
          else {
            local_158 = local_c4;
          }
          local_e8 = local_158;
          piVar2 = std::min<int>(&local_70,&local_e8);
          *in_stack_00000010 = *piVar2 - *local_58;
        }
        if (local_bc == 3) {
          if (local_c0 == -0xe9) {
            local_c0 = 0;
          }
          if (local_c4 == -0xe9) {
            local_c4 = local_6c;
          }
          if (local_c0 < 0) {
            local_15c = local_6c + local_c0;
          }
          else {
            local_15c = local_c0;
          }
          *local_50 = local_15c;
          if (local_c4 < 1) {
            local_160 = local_6c + local_c4;
          }
          else {
            local_160 = local_c4;
          }
          local_ec = local_160;
          piVar2 = std::min<int>(&local_6c,&local_ec);
          *in_stack_00000008 = *piVar2 - *local_50;
        }
      }
    }
  }
  return;
}

Assistant:

void Crop::resolve_crop_roi(const Mat& bottom_blob, int& _woffset, int& _hoffset, int& _doffset, int& _coffset, int& _outw, int& _outh, int& _outd, int& _outc) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    bool numpy_style_slice = !starts.empty() && !ends.empty();
    if (numpy_style_slice)
    {
        _woffset = 0;
        _hoffset = 0;
        _doffset = 0;
        _coffset = 0;
        _outw = w;
        _outh = h;
        _outd = d;
        _outc = channels;

        const int* starts_ptr = starts;
        const int* ends_ptr = ends;
        const int* axes_ptr = axes;

        int _axes[4] = {0, 1, 2, 3};
        int num_axis = axes.w;
        if (num_axis == 0)
        {
            num_axis = dims;
        }
        else
        {
            for (int i = 0; i < num_axis; i++)
            {
                int axis = axes_ptr[i];
                if (axis < 0)
                    axis = dims + axis;
                _axes[i] = axis;
            }
        }

        for (int i = 0; i < num_axis; i++)
        {
            int axis = _axes[i];
            int start = starts_ptr[i];
            int end = ends_ptr[i];

            if (dims == 1) // axis == 0
            {
                if (start == -233) start = 0;
                if (end == -233) end = w;
                _woffset = start >= 0 ? start : w + start;
                _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
            }
            if (dims == 2)
            {
                if (axis == 0)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = h;
                    _hoffset = start >= 0 ? start : h + start;
                    _outh = std::min(h, end > 0 ? end : h + end) - _hoffset;
                }
                if (axis == 1)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = w;
                    _woffset = start >= 0 ? start : w + start;
                    _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
                }
            }
            if (dims == 3)
            {
                if (axis == 0)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = channels;
                    _coffset = start >= 0 ? start : channels + start;
                    _outc = std::min(channels, end > 0 ? end : channels + end) - _coffset;
                }
                if (axis == 1)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = h;
                    _hoffset = start >= 0 ? start : h + start;
                    _outh = std::min(h, end > 0 ? end : h + end) - _hoffset;
                }
                if (axis == 2)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = w;
                    _woffset = start >= 0 ? start : w + start;
                    _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
                }
            }
            if (dims == 4)
            {
                if (axis == 0)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = channels;
                    _coffset = start >= 0 ? start : channels + start;
                    _outc = std::min(channels, end > 0 ? end : channels + end) - _coffset;
                }
                if (axis == 1)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = d;
                    _doffset = start >= 0 ? start : d + start;
                    _outd = std::min(d, end > 0 ? end : d + end) - _doffset;
                }
                if (axis == 2)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = h;
                    _hoffset = start >= 0 ? start : h + start;
                    _outh = std::min(h, end > 0 ? end : h + end) - _hoffset;
                }
                if (axis == 3)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = w;
                    _woffset = start >= 0 ? start : w + start;
                    _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
                }
            }
        }
    }
    else
    {
        _woffset = woffset;
        _hoffset = hoffset;
        _doffset = doffset;
        _coffset = coffset;
        _outw = w;
        _outh = h;
        _outd = d;
        _outc = channels;

        if (dims == 1)
        {
            _outw = w - woffset - woffset2;
            if (outw != -233)
                _outw = std::min(outw, _outw);
        }
        if (dims == 2)
        {
            _outw = w - woffset - woffset2;
            if (outw != -233)
                _outw = std::min(outw, _outw);

            _outh = h - hoffset - hoffset2;
            if (outh != -233)
                _outh = std::min(outh, _outh);
        }
        if (dims == 3)
        {
            _outw = w - woffset - woffset2;
            if (outw != -233)
                _outw = std::min(outw, _outw);

            _outh = h - hoffset - hoffset2;
            if (outh != -233)
                _outh = std::min(outh, _outh);

            _outc = channels - coffset - coffset2;
            if (outc != -233)
                _outc = std::min(outc, _outc);
        }
        if (dims == 4)
        {
            _outw = w - woffset - woffset2;
            if (outw != -233)
                _outw = std::min(outw, _outw);

            _outh = h - hoffset - hoffset2;
            if (outh != -233)
                _outh = std::min(outh, _outh);

            _outd = d - doffset - doffset2;
            if (outd != -233)
                _outd = std::min(outd, _outd);

            _outc = channels - coffset - coffset2;
            if (outc != -233)
                _outc = std::min(outc, _outc);
        }
    }
}